

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtmidiout.cpp
# Opt level: O2

int anon_unknown.dwarf_1963e::RtMidiOut_ctor(lua_State *L)

{
  RtMidi *midi;
  allocator<char> local_39;
  string local_38;
  
  midi = (RtMidi *)lua_newuserdata(L,0x10);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"RtMidi Output Client",&local_39);
  RtMidiOut::RtMidiOut((RtMidiOut *)midi,UNSPECIFIED,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  RtMidi_init(midi,L,-1);
  lua_getfield(L,0xfff0b9d8,"luartmidi.rtmidiout");
  lua_setmetatable(L,0xfffffffffffffffe);
  return 1;
}

Assistant:

int RtMidiOut_ctor(lua_State *L) {
	auto midiout = reinterpret_cast<RtMidiOut *>(
	 lua_newuserdata(L, sizeof(RtMidiOut)));
	try {
		new (midiout) RtMidiOut { };
		RtMidi_init(*midiout, L, -1);
		luaL_getmetatable(L, MT_RTMIDIOUT);
		lua_setmetatable(L, -2);
		return 1;
	}
	catch (RtMidiError &err) {
		auto midierror = reinterpret_cast<RtMidiError *>(
		 lua_newuserdata(L, sizeof(RtMidiError)));
		new (midierror) RtMidiError {err};
		luaL_getmetatable(L, MT_RTMIDIERROR);
		lua_setmetatable(L, -2);
		return lua_error(L);
	}
}